

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.h
# Opt level: O1

void __thiscall
FlatMap<std::__cxx11::string,int,std::less<std::__cxx11::string>>::
FlatMap<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,int>*,std::vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>>>>
          (FlatMap<std::__cxx11::string,int,std::less<std::__cxx11::string>> *this,
          reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                 *last,
          less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *comp)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *ppVar1
  ;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  _Var2;
  long lVar3;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_40;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  local_28;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  local_20;
  
  local_20._M_current = (first->current)._M_current;
  local_28._M_current = (last->current)._M_current;
  std::
  vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>::
  vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,int>*,std::vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>>>,void>
            ((vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
              *)this,(reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                      *)&local_20,
             (reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
              *)&local_28,(allocator_type *)&local_40);
  _Var2._M_current =
       *(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
         **)this;
  ppVar1 = *(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             **)(this + 8);
  if (_Var2._M_current != ppVar1) {
    lVar3 = ((long)ppVar1 - (long)_Var2._M_current >> 3) * -0x3333333333333333;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
    ::_Temporary_buffer(&local_40,_Var2,(lVar3 - (lVar3 + 1 >> 0x3f)) + 1 >> 1);
    if (local_40._M_buffer == (pointer)0x0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,int>*,std::vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<FlatMap<std::__cxx11::string,int,std::less<std::__cxx11::string>>::ValueToValueComparator>>
                (_Var2._M_current,ppVar1);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,int>*,std::vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>>,std::pair<std::__cxx11::string,int>*,long,__gnu_cxx::__ops::_Iter_comp_iter<FlatMap<std::__cxx11::string,int,std::less<std::__cxx11::string>>::ValueToValueComparator>>
                (_Var2._M_current,ppVar1,local_40._M_buffer,local_40._M_len);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
    ::~_Temporary_buffer(&local_40);
  }
  _Var2 = std::
          __unique<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,int>*,std::vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<FlatMap<std::__cxx11::string,int,std::less<std::__cxx11::string>>::FlatMap<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,int>*,std::vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>>>>(std::reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,int>*,std::vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>>>,std::reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,int>*,std::vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>>>,std::less<std::__cxx11::string>const&)::_lambda(std::pair<std::__cxx11::string,int>const&,std::pair<std::__cxx11::string,int>const&)_1_>>
                    (*(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                       **)this,
                     *(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                       **)(this + 8),
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_tdepke2[P]CircuitSim2_src___FlatMap_h:45:62)>
                      )this);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::_M_erase((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)this,(iterator)_Var2._M_current,
             *(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
               **)(this + 8));
  return;
}

Assistant:

FlatMap(InputIt first, InputIt last, const Compare& comp = Compare()) :
        vec_(first, last),
        comp_(comp),
        valueToKeyComp_(comp),
        valueToValueComp_(comp) {

        std::stable_sort(vec_.begin(), vec_.end(), valueToValueComp_);
        auto newLast = std::unique(vec_.begin(), vec_.end(), [this](const value_type& lhs, const value_type& rhs) {
            return !comp_(lhs.first, rhs.first);
        });
        vec_.erase(newLast, vec_.end());

        //mergeUnique(first, last);
    }